

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_wrapper.h
# Opt level: O2

optional<std::__cxx11::basic_string<char>_> * __thiscall
sqlite::get_col_from_db<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,sqlite *this,undefined4 param_3)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = sqlite3_column_type(this,param_3);
  if (iVar1 == 5) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    get_col_from_db(&local_40,this,param_3);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline optional<OptionalT> get_col_from_db(sqlite3_stmt* stmt, int inx, result_type<optional<OptionalT>>) {
		#ifdef MODERN_SQLITE_EXPERIMENTAL_OPTIONAL_SUPPORT
		if(sqlite3_column_type(stmt, inx) == SQLITE_NULL) {
			return std::experimental::nullopt;
		}
		return std::experimental::make_optional(get_col_from_db(stmt, inx, result_type<OptionalT>()));
		#else
		if(sqlite3_column_type(stmt, inx) == SQLITE_NULL) {
			return std::nullopt;
		}
		return std::make_optional(get_col_from_db(stmt, inx, result_type<OptionalT>()));
		#endif
	}